

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O0

vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
* __thiscall
Test::Suite::filterTests
          (vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
           *__return_storage_ptr__,Suite *this,
          vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *selectedMethods)

{
  bool bVar1;
  size_type __n;
  reference_wrapper<const_Test::Suite::TestMethod> local_68;
  TestMethod *local_60;
  TestMethod *method;
  TestMethodInfo *info;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *__range1;
  vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *selectedMethods_local;
  Suite *this_local;
  vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  *result;
  
  std::
  vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  ::vector(__return_storage_ptr__);
  __n = std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::size
                  (selectedMethods);
  std::
  vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  ::reserve(__return_storage_ptr__,__n);
  __end1 = std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::begin
                     (selectedMethods);
  info = (TestMethodInfo *)
         std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::end
                   (selectedMethods);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Test::TestMethodInfo_*,_std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>_>
                                     *)&info), bVar1) {
    method = (TestMethod *)
             __gnu_cxx::
             __normal_iterator<const_Test::TestMethodInfo_*,_std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>_>
             ::operator*(&__end1);
    local_60 = (TestMethod *)(method->name)._M_dataplus._M_p;
    local_68 = std::cref<Test::Suite::TestMethod>(local_60);
    std::
    vector<std::reference_wrapper<Test::Suite::TestMethod_const>,std::allocator<std::reference_wrapper<Test::Suite::TestMethod_const>>>
    ::emplace_back<std::reference_wrapper<Test::Suite::TestMethod_const>>
              ((vector<std::reference_wrapper<Test::Suite::TestMethod_const>,std::allocator<std::reference_wrapper<Test::Suite::TestMethod_const>>>
                *)__return_storage_ptr__,&local_68);
    __gnu_cxx::
    __normal_iterator<const_Test::TestMethodInfo_*,_std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::reference_wrapper<const Suite::TestMethod>> Suite::filterTests(
    const std::vector<TestMethodInfo> &selectedMethods) {
  std::vector<std::reference_wrapper<const TestMethod>> result;
  result.reserve(selectedMethods.size());

  for (const auto &info : selectedMethods) {
    const auto *method = reinterpret_cast<const TestMethod *>(info.reference);
    result.emplace_back(std::cref(*method));
  }

  return result;
}